

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cleanup_with_absolute_prefix_unittest.cc
# Opt level: O1

void Test_CleanImmediatelyWithAbsolutePrefix_logging::RunTest(void)

{
  ostream *poVar1;
  int iVar2;
  LogMessage local_80;
  
  local_80.allocated_ = (LogMessageData *)0x0;
  google::EnableLogCleaner((minutes *)&local_80);
  google::SetLogFilenameExtension(".barfoo");
  google::SetLogDestination(GLOG_INFO,"test_cleanup_");
  iVar2 = 1000;
  do {
    google::LogMessage::LogMessage
              (&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/cleanup_with_absolute_prefix_unittest.cc"
               ,0x40);
    poVar1 = google::LogMessage::stream(&local_80);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"cleanup test",0xc);
    google::LogMessage::~LogMessage(&local_80);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  iVar2 = 10;
  do {
    google::LogMessage::LogMessage
              (&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/cleanup_with_absolute_prefix_unittest.cc"
               ,0x44,ERROR);
    poVar1 = google::LogMessage::stream(&local_80);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"cleanup test",0xc);
    google::LogMessage::~LogMessage(&local_80);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  google::DisableLogCleaner();
  return;
}

Assistant:

TEST(CleanImmediatelyWithAbsolutePrefix, logging) {
  using namespace std::chrono_literals;
  google::EnableLogCleaner(0h);
  google::SetLogFilenameExtension(".barfoo");
  google::SetLogDestination(GLOG_INFO, "test_cleanup_");

  for (unsigned i = 0; i < 1000; ++i) {
    LOG(INFO) << "cleanup test";
  }

  for (unsigned i = 0; i < 10; ++i) {
    LOG(ERROR) << "cleanup test";
  }

  google::DisableLogCleaner();
}